

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcBuildingElementType::~IfcBuildingElementType
          (IfcBuildingElementType *this)

{
  ~IfcBuildingElementType(this);
  operator_delete(this,0x1a8);
  return;
}

Assistant:

IfcBuildingElementType() : Object("IfcBuildingElementType") {}